

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O1

uint secp256k1_scalar_get_bits_var(secp256k1_scalar *a,uint offset,uint count)

{
  byte bVar1;
  uint uVar2;
  uint extraout_EAX;
  
  if (count < 0x20) {
    if (0x100 < count + offset) goto LAB_001526e3;
    uVar2 = offset >> 6;
    if ((count + offset) - 1 >> 6 != uVar2) {
      if (offset < 0xc0) {
        bVar1 = (byte)offset & 0x3f;
        uVar2 = (uint)(a->d[uVar2] >> bVar1) | (uint)(a->d[(ulong)uVar2 + 1] << 0x40 - bVar1);
        goto LAB_001526cc;
      }
      goto LAB_001526ed;
    }
    if ((count + offset) - 1 >> 6 == uVar2) {
      uVar2 = (uint)(a->d[uVar2] >> ((byte)offset & 0x3f));
LAB_001526cc:
      return uVar2 & ~(uint)(-1L << ((byte)count & 0x3f));
    }
  }
  else {
    secp256k1_scalar_get_bits_var_cold_4();
LAB_001526e3:
    secp256k1_scalar_get_bits_var_cold_3();
  }
  secp256k1_scalar_get_bits_var_cold_2();
LAB_001526ed:
  secp256k1_scalar_get_bits_var_cold_1();
  ((secp256k1_ge *)a)->infinity = 1;
  (((secp256k1_ge *)a)->x).magnitude = 0;
  (((secp256k1_ge *)a)->x).normalized = 1;
  (((secp256k1_ge *)a)->x).n[0] = 0;
  (((secp256k1_ge *)a)->x).n[1] = 0;
  (((secp256k1_ge *)a)->x).n[2] = 0;
  (((secp256k1_ge *)a)->x).n[3] = 0;
  (((secp256k1_ge *)a)->x).n[4] = 0;
  secp256k1_fe_verify((secp256k1_fe *)a);
  (((secp256k1_ge *)a)->y).magnitude = 0;
  (((secp256k1_ge *)a)->y).normalized = 1;
  (((secp256k1_ge *)a)->y).n[0] = 0;
  (((secp256k1_ge *)a)->y).n[1] = 0;
  (((secp256k1_ge *)a)->y).n[2] = 0;
  (((secp256k1_ge *)a)->y).n[3] = 0;
  (((secp256k1_ge *)a)->y).n[4] = 0;
  secp256k1_fe_verify(&((secp256k1_ge *)a)->y);
  secp256k1_ge_verify((secp256k1_ge *)a);
  return extraout_EAX;
}

Assistant:

SECP256K1_INLINE static unsigned int secp256k1_scalar_get_bits_var(const secp256k1_scalar *a, unsigned int offset, unsigned int count) {
    VERIFY_CHECK(count < 32);
    VERIFY_CHECK(offset + count <= 256);
    if ((offset + count - 1) >> 6 == offset >> 6) {
        return secp256k1_scalar_get_bits(a, offset, count);
    } else {
        VERIFY_CHECK((offset >> 6) + 1 < 4);
        return ((a->d[offset >> 6] >> (offset & 0x3F)) | (a->d[(offset >> 6) + 1] << (64 - (offset & 0x3F)))) & ((((uint64_t)1) << count) - 1);
    }
}